

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  bool bVar11;
  slot_type *ppFVar12;
  ulong uVar13;
  size_t sVar14;
  uintptr_t v;
  byte bVar15;
  size_t sVar16;
  ctrl_t cVar17;
  ulong uVar18;
  FindInfo FVar19;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  undefined1 local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe14,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("!set->fits_in_soo(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe15,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  sVar14 = common->capacity_;
  if (sVar14 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  uVar1 = common->size_;
  if (1 < uVar1 && sVar14 == 1) {
    ppFVar12 = soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         *)common);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*ppFVar12;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = &(*ppFVar12)->super_SymbolBase +
                   (SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8));
    bVar15 = (SUB161(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB161(auVar5 * ZEXT816(0x9ddfea08eb382d69),0)) & 0x7f;
    local_40 = (byte)common->size_;
    local_48 = common->capacity_;
  }
  else {
    bVar15 = 0x80;
    local_40 = (byte)uVar1;
    local_48 = sVar14;
  }
  local_40 = local_40 & 1;
  local_3f = sVar14 == 1;
  local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
  local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
  local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
  local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
  common->capacity_ = new_capacity;
  local_3e = 1 < uVar1 && sVar14 == 1;
  bVar11 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                     ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar15,8,8);
  if (local_48 == 0) {
    __assert_fail("resize_helper.old_capacity() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe38,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if (sVar14 != 1 || 1 < uVar1) {
    ppFVar12 = slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)common);
    if (!bVar11) {
      if (sVar14 == 1) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (long)&hash_internal::MixingHashState::kSeed +
                       CONCAT44(local_58._4_4_,local_58._0_4_);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0) ^
                       SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8)) +
                       CONCAT44(local_58._4_4_,local_58._0_4_);
        uVar18 = SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0);
        FVar19 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar18);
        uVar13 = FVar19.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar13) {
LAB_0021f8a1:
          __assert_fail("i < c.capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x70c,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar17 = (ctrl_t)uVar18 & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar13] = cVar17;
        pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar13 - 0xf & uVar1)] = cVar17;
        ppFVar12[uVar13] = (slot_type)CONCAT44(local_58._4_4_,local_58._0_4_);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          lVar10 = CONCAT44(local_58._12_4_,local_58._8_4_);
          sVar16 = 0;
          sVar14 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar16)) {
              lVar3 = *(long *)(lVar10 + sVar16 * 8);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar3;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = (SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0) ^
                             SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8)) + lVar3;
              uVar18 = SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar19 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar18);
              uVar13 = FVar19.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar13) goto LAB_0021f8a1;
              cVar17 = (ctrl_t)uVar18 & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar13] = cVar17;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar13 - 0xf & uVar1)] = cVar17;
              ppFVar12[uVar13] = *(slot_type *)(lVar10 + sVar16 * 8);
              sVar14 = local_48;
            }
            sVar16 = sVar16 + 1;
          } while (sVar16 != sVar14);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }